

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagsValidator_CommandLineFlagInfo::Run(void)

{
  pointer pcVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  FlagSaver fs;
  CommandLineFlagInfo info;
  FlagSaver FStack_1d8;
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  bool local_110;
  bool bStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  void *pvStack_108;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  char local_d0 [16];
  _Alloc_hider local_c0;
  char local_b0 [16];
  _Alloc_hider local_a0;
  char local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  _Alloc_hider local_60;
  char local_50 [24];
  void *pvStack_38;
  
  FlagSaver::FlagSaver(&FStack_1d8);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator","CommandLineFlagInfo");
  local_1d0._0_8_ = local_1d0 + 0x10;
  local_1d0._8_8_ = 0;
  local_1d0[0x10] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190._M_p = (pointer)&local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_170._M_p = (pointer)&local_160;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_150._M_p = (pointer)&local_140;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130._M_p = (pointer)&local_120;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  GetCommandLineFlagInfoOrDie((CommandLineFlagInfo *)local_100,"test_flag");
  std::__cxx11::string::operator=((string *)local_1d0,(string *)local_100);
  std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_190,(string *)&local_c0);
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_a0);
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_80);
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_60);
  local_110 = (bool)local_50[0x10];
  bStack_10f = (bool)local_50[0x11];
  uStack_10e = local_50[0x12];
  uStack_10d = local_50[0x13];
  uStack_10c = local_50[0x14];
  uStack_10b = local_50[0x15];
  uStack_10a = local_50[0x16];
  uStack_109 = local_50[0x17];
  pvStack_108 = pvStack_38;
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p);
  }
  if (local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p);
  }
  pcVar1 = local_100 + 0x10;
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_);
  }
  if (local_110 == true) {
    _GLOBAL__N_1::Test_FlagsValidator_CommandLineFlagInfo::Run();
LAB_0013b573:
    _GLOBAL__N_1::Test_FlagsValidator_CommandLineFlagInfo::Run();
LAB_0013b578:
    _GLOBAL__N_1::Test_FlagsValidator_CommandLineFlagInfo::Run();
  }
  else {
    bVar2 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
    if (!bVar2) goto LAB_0013b573;
    GetCommandLineFlagInfoOrDie((CommandLineFlagInfo *)local_100,"test_flag");
    std::__cxx11::string::operator=((string *)local_1d0,(string *)local_100);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_e0);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_c0);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_a0);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_80);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_60);
    local_110 = (bool)local_50[0x10];
    bStack_10f = (bool)local_50[0x11];
    uStack_10e = local_50[0x12];
    uStack_10d = local_50[0x13];
    uStack_10c = local_50[0x14];
    uStack_10b = local_50[0x15];
    uStack_10a = local_50[0x16];
    uStack_109 = local_50[0x17];
    pvStack_108 = pvStack_38;
    if (local_60._M_p != local_50) {
      operator_delete(local_60._M_p);
    }
    if (local_80._M_p != local_70) {
      operator_delete(local_80._M_p);
    }
    if (local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p);
    }
    if (local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p);
    }
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    if ((pointer)local_100._0_8_ != pcVar1) {
      operator_delete((void *)local_100._0_8_);
    }
    if (local_110 == false) goto LAB_0013b578;
    bVar2 = RegisterFlagValidator
                      (&(anonymous_namespace)::fLI::FLAGS_test_flag,(_func_bool_char_ptr_int32 *)0x0
                      );
    if (bVar2) {
      GetCommandLineFlagInfoOrDie((CommandLineFlagInfo *)local_100,"test_flag");
      std::__cxx11::string::operator=((string *)local_1d0,(string *)local_100);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_e0);
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_c0);
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_a0);
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_80);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_60);
      local_110 = (bool)local_50[0x10];
      bStack_10f = (bool)local_50[0x11];
      uStack_10e = local_50[0x12];
      uStack_10d = local_50[0x13];
      uStack_10c = local_50[0x14];
      uStack_10b = local_50[0x15];
      uStack_10a = local_50[0x16];
      uStack_109 = local_50[0x17];
      pvStack_108 = pvStack_38;
      if (local_60._M_p != local_50) {
        operator_delete(local_60._M_p);
      }
      if (local_80._M_p != local_70) {
        operator_delete(local_80._M_p);
      }
      if (local_a0._M_p != local_90) {
        operator_delete(local_a0._M_p);
      }
      if (local_c0._M_p != local_b0) {
        operator_delete(local_c0._M_p);
      }
      if (local_e0._M_p != local_d0) {
        operator_delete(local_e0._M_p);
      }
      if ((pointer)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_);
      }
      if (local_110 != true) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_p != &local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        FlagSaver::~FlagSaver(&FStack_1d8);
        return;
      }
      goto LAB_0013b582;
    }
  }
  _GLOBAL__N_1::Test_FlagsValidator_CommandLineFlagInfo::Run();
LAB_0013b582:
  _GLOBAL__N_1::Test_FlagsValidator_CommandLineFlagInfo::Run();
  CommandLineFlagInfo::~CommandLineFlagInfo((CommandLineFlagInfo *)local_1d0);
  FlagSaver::~FlagSaver(&FStack_1d8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagsValidator, CommandLineFlagInfo) {
  CommandLineFlagInfo info;
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_FALSE(info.has_validator_fn);

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_TRUE(info.has_validator_fn);

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_FALSE(info.has_validator_fn);
}